

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O0

handle pybind11::detail::
       map_caster<std::map<std::__cxx11::string,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>>>,std::__cxx11::string,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>
       ::
       cast<std::map<std::__cxx11::string,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>>>const&>
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>_>
                  *src,return_value_policy policy,handle parent)

{
  return_value_policy policy_00;
  bool bVar1;
  forwarded_type<const_std::map<std::__cxx11::basic_string<char>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_&,_const_std::__cxx11::basic_string<char>_&>
  src_00;
  handle h;
  forwarded_type<const_std::map<std::__cxx11::basic_string<char>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_&,_const_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_&>
  src_01;
  item_accessor local_c0;
  int local_9c;
  PyObject *local_98;
  PyObject *local_90;
  handle local_88;
  object value;
  handle local_60;
  object key;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>
  *kv;
  const_iterator __end0;
  const_iterator __begin0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>_>
  *__range3;
  return_value_policy policy_value;
  return_value_policy policy_key;
  dict d;
  return_value_policy policy_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>_>
  *src_local;
  handle parent_local;
  
  d.super_object.super_handle.m_ptr._7_1_ = policy;
  dict::dict((dict *)&stack0xffffffffffffffd0);
  policy_00 = d.super_object.super_handle.m_ptr._7_1_;
  __end0 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>_>
           ::begin(src);
  kv = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>
        *)std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>_>
          ::end(src);
  while (bVar1 = std::operator!=(&__end0,(_Self *)&kv), bVar1) {
    key.super_handle.m_ptr =
         (handle)std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>
                 ::operator*(&__end0);
    src_00 = forward_like<std::map<std::__cxx11::string,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>>>const&,std::__cxx11::string_const&>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        key.super_handle.m_ptr);
    value.super_handle.m_ptr = (handle)(handle)parent.m_ptr;
    h = string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
        ::cast(src_00,policy_00,parent);
    reinterpret_steal<pybind11::object>((pybind11 *)&local_60,h);
    src_01 = forward_like<std::map<std::__cxx11::string,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>>>const&,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>const&>
                       ((tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>
                         *)((long)key.super_handle.m_ptr + 0x20));
    local_98 = parent.m_ptr;
    local_90 = (PyObject *)
               tuple_caster<std::tuple,unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>
               ::
               cast<std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>const&>
                         (src_01,policy_00,parent);
    reinterpret_steal<pybind11::object>((pybind11 *)&local_88,(handle)local_90);
    bVar1 = pybind11::handle::operator_cast_to_bool(&local_60);
    if ((bVar1) && (bVar1 = pybind11::handle::operator_cast_to_bool(&local_88), bVar1)) {
      object_api<pybind11::handle>::operator[]
                (&local_c0,(object_api<pybind11::handle> *)&stack0xffffffffffffffd0,local_60);
      accessor<pybind11::detail::accessor_policies::generic_item>::operator=
                (&local_c0,(object *)&local_88);
      accessor<pybind11::detail::accessor_policies::generic_item>::~accessor(&local_c0);
      local_9c = 0;
    }
    else {
      memset(&parent_local,0,8);
      pybind11::handle::handle(&parent_local);
      local_9c = 1;
    }
    object::~object((object *)&local_88);
    object::~object((object *)&local_60);
    if (local_9c != 0) goto LAB_0079e503;
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>
    ::operator++(&__end0);
  }
  parent_local = object::release((object *)&stack0xffffffffffffffd0);
  local_9c = 1;
LAB_0079e503:
  dict::~dict((dict *)&stack0xffffffffffffffd0);
  return (handle)parent_local.m_ptr;
}

Assistant:

static handle cast(T &&src, return_value_policy policy, handle parent) {
        dict d;
        return_value_policy policy_key = policy;
        return_value_policy policy_value = policy;
        if (!std::is_lvalue_reference<T>::value) {
            policy_key = return_value_policy_override<Key>::policy(policy_key);
            policy_value = return_value_policy_override<Value>::policy(policy_value);
        }
        for (auto &&kv : src) {
            auto key = reinterpret_steal<object>(key_conv::cast(forward_like<T>(kv.first), policy_key, parent));
            auto value = reinterpret_steal<object>(value_conv::cast(forward_like<T>(kv.second), policy_value, parent));
            if (!key || !value)
                return handle();
            d[key] = value;
        }
        return d.release();
    }